

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:435:23)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:435:23)>
             *this)

{
  MutexGuarded<unsigned_int> *this_00;
  
  usleep(10000);
  this_00 = (this->f).value;
  _::Mutex::lock(&this_00->mutex);
  _::Mutex::induceSpuriousWakeupForTest(&this_00->mutex);
  if (this_00 != (MutexGuarded<unsigned_int> *)0x0) {
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }